

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-create.cc
# Opt level: O1

void __thiscall
ImageProvider::provideStreamData(ImageProvider *this,QPDFObjGen *param_1,Pipeline *pipeline)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  undefined1 local_81;
  uint local_80;
  action_e local_7c;
  shared_ptr<Pipeline> p_new;
  Pl_RunLength *local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_60 [2];
  Pipeline *pipeline_local;
  vector<std::shared_ptr<Pipeline>,_std::allocator<std::shared_ptr<Pipeline>_>_> to_delete;
  int local_2c;
  
  to_delete.
  super__Vector_base<std::shared_ptr<Pipeline>,_std::allocator<std::shared_ptr<Pipeline>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  to_delete.
  super__Vector_base<std::shared_ptr<Pipeline>,_std::allocator<std::shared_ptr<Pipeline>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  to_delete.
  super__Vector_base<std::shared_ptr<Pipeline>,_std::allocator<std::shared_ptr<Pipeline>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_new.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  p_new.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  pipeline_local = pipeline;
  iVar3 = std::__cxx11::string::compare((char *)&this->filter);
  if (iVar3 == 0) {
    if (this->width >> 0x20 != 0) {
      QIntC::IntConverter<unsigned_long,_unsigned_int,_false,_false>::error(this->width);
    }
    local_7c = (action_e)this->width;
    uVar5 = this->n_stripes * this->stripe_height;
    if (uVar5 >> 0x20 != 0) {
      QIntC::IntConverter<unsigned_long,_unsigned_int,_false,_false>::error(uVar5);
    }
    local_80 = (uint)uVar5;
    uVar5 = ((this->stripes).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_string_length;
    if ((uVar5 & 0xffffffff80000000) != 0) {
      QIntC::IntConverter<unsigned_long,_int,_false,_true>::error(uVar5);
    }
    local_2c = (int)uVar5;
    local_68 = (Pl_RunLength *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<Pl_DCT,std::allocator<Pl_DCT>,char_const(&)[14],Pipeline*&,unsigned_int,unsigned_int,int,J_COLOR_SPACE&>
              (a_Stack_60,(Pl_DCT **)&local_68,(allocator<Pl_DCT> *)&local_81,
               (char (*) [14])"image encoder",&pipeline_local,&local_7c,&local_80,&local_2c,
               &this->j_color_space);
    _Var2._M_pi = a_Stack_60[0]._M_pi;
    p_new.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)local_68
    ;
    _Var1 = p_new.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    local_68 = (Pl_RunLength *)0x0;
    a_Stack_60[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_new.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var2._M_pi;
    if (_Var1._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var1._M_pi);
    }
    if (a_Stack_60[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_60[0]._M_pi);
    }
    std::vector<std::shared_ptr<Pipeline>,_std::allocator<std::shared_ptr<Pipeline>_>_>::push_back
              (&to_delete,&p_new);
    pipeline = p_new.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)&this->filter);
    if (iVar3 == 0) {
      local_7c = a_encode;
      local_68 = (Pl_RunLength *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<Pl_RunLength,std::allocator<Pl_RunLength>,char_const(&)[14],Pipeline*&,Pl_RunLength::action_e>
                (a_Stack_60,&local_68,(allocator<Pl_RunLength> *)&local_80,
                 (char (*) [14])"image encoder",&pipeline_local,&local_7c);
      _Var2._M_pi = a_Stack_60[0]._M_pi;
      p_new.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_68;
      _Var1 = p_new.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      local_68 = (Pl_RunLength *)0x0;
      a_Stack_60[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_new.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var2._M_pi
      ;
      if (_Var1._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var1._M_pi);
      }
      if (a_Stack_60[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_60[0]._M_pi);
      }
      std::vector<std::shared_ptr<Pipeline>,_std::allocator<std::shared_ptr<Pipeline>_>_>::push_back
                (&to_delete,&p_new);
      pipeline = p_new.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    }
  }
  if (this->n_stripes != 0) {
    uVar5 = 0;
    do {
      if (this->stripe_height * this->width != 0) {
        uVar4 = 0;
        do {
          Pipeline::writeString((string *)pipeline);
          uVar4 = uVar4 + 1;
        } while (uVar4 < this->stripe_height * this->width);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < this->n_stripes);
  }
  (**(code **)(*(long *)pipeline + 0x18))(pipeline);
  if (p_new.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (p_new.super___shared_ptr<Pipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  std::vector<std::shared_ptr<Pipeline>,_std::allocator<std::shared_ptr<Pipeline>_>_>::~vector
            (&to_delete);
  return;
}

Assistant:

void
ImageProvider::provideStreamData(QPDFObjGen const&, Pipeline* pipeline)
{
    std::vector<std::shared_ptr<Pipeline>> to_delete;
    Pipeline* p = pipeline;
    std::shared_ptr<Pipeline> p_new;

    if (filter == "/DCTDecode") {
        p_new = std::make_shared<Pl_DCT>(
            "image encoder",
            pipeline,
            QIntC::to_uint(width),
            QIntC::to_uint(getHeight()),
            QIntC::to_int(stripes[0].length()),
            j_color_space);
        to_delete.push_back(p_new);
        p = p_new.get();
    } else if (filter == "/RunLengthDecode") {
        p_new = std::make_shared<Pl_RunLength>("image encoder", pipeline, Pl_RunLength::a_encode);
        to_delete.push_back(p_new);
        p = p_new.get();
    }

    for (size_t i = 0; i < n_stripes; ++i) {
        for (size_t j = 0; j < width * stripe_height; ++j) {
            p->writeString(stripes[i]);
        }
    }
    p->finish();
}